

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall
groundupdb::HashedValue::
HashedValue<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (HashedValue *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *from)

{
  bool bVar1;
  reference pbVar2;
  iterator __first;
  iterator __last;
  size_type sVar3;
  size_t sVar4;
  DefaultHash local_150;
  DefaultHash h1;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_130;
  const_iterator local_128;
  byte *local_120;
  byte *local_118;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_110;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_108;
  const_iterator local_100;
  undefined1 local_f8 [8];
  Bytes t;
  undefined1 local_c0 [8];
  HashedValue hv;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  iterator iter;
  Bytes data;
  undefined1 local_50 [8];
  decay_t<std::unordered_set<std::__cxx11::basic_string<char>_>_> v;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *from_local;
  HashedValue *this_local;
  
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_002c66f8;
  this->m_has_value = true;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v._M_h._M_single_bucket = (__node_base_ptr)from;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&this->m_data);
  this->m_length = 0;
  this->m_hash = 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,from);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&iter);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
  while( true ) {
    hv.m_hash = (size_t)std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_50);
    bVar1 = std::__detail::operator!=
                      (&local_80,
                       (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&hv.m_hash);
    if (!bVar1) break;
    pbVar2 = std::__detail::
             _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)&local_80);
    std::__cxx11::string::string
              ((string *)
               &t.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)pbVar2);
    HashedValue<std::__cxx11::string>
              ((HashedValue *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &t.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &t.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    HashedValue::data((Bytes *)local_f8,(HashedValue *)local_c0);
    local_108._M_current =
         (byte *)std::end<std::vector<std::byte,std::allocator<std::byte>>>
                           ((vector<std::byte,_std::allocator<std::byte>_> *)&iter);
    __gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>
    ::__normal_iterator<std::byte*>
              ((__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>
                *)&local_100,&local_108);
    local_110._M_current =
         (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::begin
                           ((vector<std::byte,_std::allocator<std::byte>_> *)local_f8);
    local_118 = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                                  ((vector<std::byte,_std::allocator<std::byte>_> *)local_f8);
    local_120 = (byte *)std::vector<std::byte,std::allocator<std::byte>>::
                        insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                  ((vector<std::byte,std::allocator<std::byte>> *)&iter,local_100,
                                   local_110,
                                   (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                    )local_118);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_f8);
    ~HashedValue((HashedValue *)local_c0);
    std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)&local_80);
  }
  local_130._M_current =
       (byte *)std::end<std::vector<std::byte,std::allocator<std::byte>>>(&this->m_data);
  __gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>::
  __normal_iterator<std::byte*>
            ((__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>> *
             )&local_128,&local_130);
  __first = std::vector<std::byte,_std::allocator<std::byte>_>::begin
                      ((vector<std::byte,_std::allocator<std::byte>_> *)&iter);
  __last = std::vector<std::byte,_std::allocator<std::byte>_>::end
                     ((vector<std::byte,_std::allocator<std::byte>_> *)&iter);
  h1.mImpl._M_t.
  super___uniq_ptr_impl<groundupdb::DefaultHash::Impl,_std::default_delete<groundupdb::DefaultHash::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_groundupdb::DefaultHash::Impl_*,_std::default_delete<groundupdb::DefaultHash::Impl>_>
  .super__Head_base<0UL,_groundupdb::DefaultHash::Impl_*,_false>._M_head_impl =
       (unique_ptr<groundupdb::DefaultHash::Impl,_std::default_delete<groundupdb::DefaultHash::Impl>_>
        )std::vector<std::byte,std::allocator<std::byte>>::
         insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                   ((vector<std::byte,std::allocator<std::byte>> *)&this->m_data,local_128,
                    (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                     )__first._M_current,
                    (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                     )__last._M_current);
  sVar3 = std::vector<std::byte,_std::allocator<std::byte>_>::size(&this->m_data);
  this->m_length = sVar3;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&iter);
  DefaultHash::DefaultHash(&local_150,1,2,3,4);
  sVar4 = DefaultHash::operator()(&local_150,&this->m_data);
  this->m_hash = sVar4;
  DefaultHash::~DefaultHash(&local_150);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
  return;
}

Assistant:

HashedValue(VT from) : m_has_value(true), m_data(), m_length(0), m_hash(0)
  {
    // first remove reference
    auto v = std::decay_t<VT>(from);
    // second check if its a basic type and convert to bytes
    if constexpr(std::is_same_v<std::string, decltype(v)>) {
      //std::cout << "DECLTYPE std::string" << std::endl;
      m_length = from.length();
      m_data.reserve(m_length);
      std::transform(from.begin(), from.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });
                     
    } else if constexpr (std::is_same_v<char *, decltype(v)>) {
      //std::cout << "DECLTYPE char ptr" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr (std::is_same_v<const char*, decltype(v)>) {
      //std::cout << "DECLTYPE char array" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr(std::numeric_limits<VT>::is_integer) {
      //std::cout << "DECLTYPE numeric" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((vcopy & 0xFF)));
        vcopy = vcopy >> sizeof(std::byte);
      }

    } else if constexpr(std::is_floating_point_v<VT>) {
      //std::cout << "DECLTYPE float" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      unsigned int asInt = *((int *)&vcopy);
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((asInt & 0xFF)));
        asInt = asInt >> sizeof(std::byte);
      }

    } else if constexpr (std::is_same_v<Bytes, decltype(v)>) {
      m_length = from.size();
      m_data = std::move(from);

    } else if constexpr (is_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(*iter); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
    // } else if constexpr (is_keyed_container<decltype(v)>::value) {
    //   std::cout << "DECLTYPE keyed container" << std::endl;

    
    } else if constexpr (is_keyed_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(iter->second); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
      

/*
    } else if constexpr(std::is_convertible_v<decltype(v),HashedValue> && !std::is_same_v<decltype(v),HashedValue>) {
      HashedValue hv = v; // calls type cast operator - https://www.cplusplus.com/doc/tutorial/typecasting/
      m_has_value = hv.m_has_value;
      m_length = hv.m_length;
      m_data = std::move(hv.m_data);
      m_hash = hv.m_hash;
      return; // no need to recompute hash

      */
    } else {
      throw std::runtime_error(typeid(v).name());
      // TODO we don't support it, fire off a compiler warning
      //static_assert(false, "Must be a supported type, or convertible to std::vector<std::byte>!");
    }
    // TODO use correct hasher for current database connection, with correct initialisation settings
    DefaultHash h1{1, 2, 3, 4};
    m_hash = h1(m_data);
  }